

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O0

bool __thiscall btBox2dShape::isInside(btBox2dShape *this,btVector3 *pt,btScalar tolerance)

{
  float fVar1;
  btVector3 *pbVar2;
  btScalar *pbVar3;
  btVector3 *in_RSI;
  btBox2dShape *in_RDI;
  float in_XMM0_Da;
  bool result;
  btVector3 halfExtents;
  bool local_26;
  btVector3 local_24;
  float local_14;
  btVector3 *local_10;
  
  local_14 = in_XMM0_Da;
  local_10 = in_RSI;
  pbVar2 = getHalfExtentsWithoutMargin(in_RDI);
  local_24.m_floats._0_8_ = *(undefined8 *)pbVar2->m_floats;
  local_24.m_floats._8_8_ = *(undefined8 *)(pbVar2->m_floats + 2);
  pbVar3 = btVector3::x(local_10);
  fVar1 = *pbVar3;
  pbVar3 = btVector3::x(&local_24);
  local_26 = false;
  if (fVar1 <= *pbVar3 + local_14) {
    pbVar3 = btVector3::x(local_10);
    fVar1 = *pbVar3;
    pbVar3 = btVector3::x(&local_24);
    local_26 = false;
    if (-*pbVar3 - local_14 <= fVar1) {
      pbVar3 = btVector3::y(local_10);
      fVar1 = *pbVar3;
      pbVar3 = btVector3::y(&local_24);
      local_26 = false;
      if (fVar1 <= *pbVar3 + local_14) {
        pbVar3 = btVector3::y(local_10);
        fVar1 = *pbVar3;
        pbVar3 = btVector3::y(&local_24);
        local_26 = false;
        if (-*pbVar3 - local_14 <= fVar1) {
          pbVar3 = btVector3::z(local_10);
          fVar1 = *pbVar3;
          pbVar3 = btVector3::z(&local_24);
          local_26 = false;
          if (fVar1 <= *pbVar3 + local_14) {
            pbVar3 = btVector3::z(local_10);
            fVar1 = *pbVar3;
            pbVar3 = btVector3::z(&local_24);
            local_26 = -*pbVar3 - local_14 <= fVar1;
          }
        }
      }
    }
  }
  return local_26;
}

Assistant:

virtual	bool isInside(const btVector3& pt,btScalar tolerance) const
	{
		btVector3 halfExtents = getHalfExtentsWithoutMargin();

		//btScalar minDist = 2*tolerance;
		
		bool result =	(pt.x() <= (halfExtents.x()+tolerance)) &&
						(pt.x() >= (-halfExtents.x()-tolerance)) &&
						(pt.y() <= (halfExtents.y()+tolerance)) &&
						(pt.y() >= (-halfExtents.y()-tolerance)) &&
						(pt.z() <= (halfExtents.z()+tolerance)) &&
						(pt.z() >= (-halfExtents.z()-tolerance));
		
		return result;
	}